

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<Clasp::ClaspConfig::Impl::ConfiguratorProxy>
               (ConfiguratorProxy *first,ConfiguratorProxy *last,ConfiguratorProxy *x)

{
  uint64 uVar1;
  
  switch((uint)((int)last - (int)first) >> 4 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
      first = first + 1;
switchD_0011cc9e_caseD_7:
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
      first = first + 1;
switchD_0011cc9e_caseD_6:
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
      first = first + 1;
switchD_0011cc9e_caseD_5:
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
      first = first + 1;
switchD_0011cc9e_caseD_4:
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
      first = first + 1;
switchD_0011cc9e_caseD_3:
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
      first = first + 1;
switchD_0011cc9e_caseD_2:
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
      first = first + 1;
switchD_0011cc9e_caseD_1:
      uVar1 = x->set;
      first->cfg = x->cfg;
      first->set = uVar1;
    }
    break;
  case 1:
    goto switchD_0011cc9e_caseD_1;
  case 2:
    goto switchD_0011cc9e_caseD_2;
  case 3:
    goto switchD_0011cc9e_caseD_3;
  case 4:
    goto switchD_0011cc9e_caseD_4;
  case 5:
    goto switchD_0011cc9e_caseD_5;
  case 6:
    goto switchD_0011cc9e_caseD_6;
  case 7:
    goto switchD_0011cc9e_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}